

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O2

void __thiscall
ByteCodeGenerator::PushJumpCleanupForTry
          (ByteCodeGenerator *this,OpCode tryOp,ByteCodeLabel label,RegSlot regSlot1,
          RegSlot regSlot2)

{
  JumpCleanupInfo local_28;
  
  local_28.loopNode = (ParseNode *)0x0;
  local_28.loopId = 0;
  local_28.tryOp = tryOp;
  local_28.label = label;
  local_28.regSlot1 = regSlot1;
  local_28.regSlot2 = regSlot2;
  DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this->jumpCleanupList,&local_28);
  return;
}

Assistant:

void PushJumpCleanupForTry(
        Js::OpCode tryOp,
        Js::ByteCodeLabel label = 0,
        Js::RegSlot regSlot1 = Js::Constants::NoRegister,
        Js::RegSlot regSlot2 = Js::Constants::NoRegister)
    {
        this->jumpCleanupList->Prepend({nullptr, 0, tryOp, label, regSlot1, regSlot2});
    }